

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>
CreateChainParams(ArgsManager *args,ChainType chain)

{
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  SigNetOptions opts;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_90;
  ulong uStack_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  _Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  undefined1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      CChainParams::Main();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      CChainParams::TestNet();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  case 2:
    uStack_78 = uStack_78 & 0xffffffffffffff00;
    local_58._M_buckets = (__buckets_ptr)((ulong)local_58._M_buckets & 0xffffffffffffff00);
    ReadSigNetArgs((ArgsManager *)CONCAT44(in_register_00000034,chain),
                   (SigNetOptions *)&local_90._M_value);
    CChainParams::SigNet((CChainParams *)args,(SigNetOptions *)&local_90._M_value);
    if ((char)local_58._M_buckets == '\x01') {
      local_58._M_buckets = (__buckets_ptr)((ulong)local_58._M_buckets & 0xffffffffffffff00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
    }
    if (((char)uStack_78 == '\x01') &&
       (uStack_78 = uStack_78 & 0xffffffffffffff00,
       (pointer *)
       local_90._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer *)0x0)) {
      operator_delete(local_90._M_value.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90._M_value.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_90._0_8_);
    }
    goto LAB_0012b54e;
  case 3:
    local_90._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 0x10);
    local_90._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    local_90._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uStack_78 = 0;
    local_70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
    local_58._M_buckets = &local_58._M_single_bucket;
    local_70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_bucket_count = 1;
    local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_58._M_element_count = 0;
    local_58._M_rehash_policy._M_max_load_factor = 1.0;
    local_58._M_rehash_policy._4_4_ = 0;
    local_58._M_rehash_policy._M_next_resize = 0;
    local_58._M_single_bucket = (__node_base_ptr)0x0;
    local_20 = 0;
    ReadRegTestArgs((ArgsManager *)CONCAT44(in_register_00000034,chain),
                    (RegTestOptions *)&local_90._M_value);
    CChainParams::RegTest((CChainParams *)args,(RegTestOptions *)&local_90._M_value);
    std::
    _Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58);
    std::
    _Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_90._M_value);
LAB_0012b54e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (__uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true>
              )(__uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true>
                )args;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      CChainParams::TestNet4();
      return (unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>)args;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparams.cpp"
                  ,0x83,
                  "std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager &, const ChainType)"
                 );
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager& args, const ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return CChainParams::Main();
    case ChainType::TESTNET:
        return CChainParams::TestNet();
    case ChainType::TESTNET4:
        return CChainParams::TestNet4();
    case ChainType::SIGNET: {
        auto opts = CChainParams::SigNetOptions{};
        ReadSigNetArgs(args, opts);
        return CChainParams::SigNet(opts);
    }
    case ChainType::REGTEST: {
        auto opts = CChainParams::RegTestOptions{};
        ReadRegTestArgs(args, opts);
        return CChainParams::RegTest(opts);
    }
    }
    assert(false);
}